

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jishmo.c
# Opt level: O3

int decode_packet(AVPacket *pkt)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  FILE *__s;
  long lVar5;
  ulong uVar6;
  short *psVar7;
  char *pcVar8;
  size_t __size;
  short *psVar9;
  short *psVar10;
  short *psVar11;
  ulong uVar12;
  char szFileName [255];
  short *local_1d0;
  char local_138 [264];
  
  iVar4 = avcodec_send_packet(video_dec_ctx);
  memset(local_138,0,0xff);
  if (iVar4 < 0) {
    decode_packet_cold_3();
  }
  else {
    while ((iVar4 = avcodec_receive_frame(video_dec_ctx,frame), iVar4 != -0x20464f45 &&
           (iVar4 != -0xb))) {
      if (iVar4 < 0) {
        decode_packet_cold_2();
        return iVar4;
      }
      video_frame_count = video_frame_count + 1;
      sprintf(local_138,"./output/mv/%d.json");
      pcVar8 = "w";
      __s = fopen(local_138,"w");
      if (__s == (FILE *)0x0) {
        decode_packet_cold_1();
        iVar4 = extract_motion_vectors(*(char **)(pcVar8 + 8));
        return iVar4;
      }
      fwrite("[\n",2,1,__s);
      lVar5 = av_frame_get_side_data(frame,8);
      if ((lVar5 != 0) && (0x27 < (ulong)(long)*(int *)(lVar5 + 0x10))) {
        lVar2 = *(long *)(lVar5 + 8);
        uVar6 = (ulong)(long)*(int *)(lVar5 + 0x10) / 0x28;
        psVar10 = (short *)(lVar2 + 6);
        uVar12 = 0;
        do {
          lVar1 = lVar2 + uVar12 * 0x28;
          fwrite("\t{\n",3,1,__s);
          fprintf(__s,"\t\t\"source\" : %d,\n",(ulong)*(uint *)(psVar10 + -3));
          fprintf(__s,"\t\t\"width\" : %d,\n",(ulong)*(byte *)(psVar10 + -1));
          fprintf(__s,"\t\t\"height\" : %d,\n",(ulong)*(byte *)((long)psVar10 + -1));
          iVar4 = *(int *)(psVar10 + -3);
          if (uVar12 == uVar6 - 1) {
            if (iVar4 < 0) {
              fprintf(__s,"\t\t\"src_x\" : %d,\n",(long)(int)*psVar10 / (long)-iVar4 & 0xffffffff);
              local_1d0 = psVar10 + 1;
              iVar4 = *(int *)(psVar10 + -3);
              iVar3 = -iVar4;
              if (0 < iVar4) {
                iVar3 = iVar4;
              }
              fprintf(__s,"\t\t\"src_y\" : %d,\n",(long)(int)psVar10[1] / (long)iVar3 & 0xffffffff);
              psVar7 = psVar10 + 2;
              iVar4 = *(int *)(psVar10 + -3);
              iVar3 = -iVar4;
              if (0 < iVar4) {
                iVar3 = iVar4;
              }
              fprintf(__s,"\t\t\"dst_x\" : %d,\n",(long)(int)psVar10[2] / (long)iVar3 & 0xffffffff);
              psVar9 = psVar10 + 3;
              psVar11 = psVar10;
            }
            else {
              fprintf(__s,"\t\t\"src_x\" : %d,\n",(long)(int)psVar10[2] / (long)iVar4 & 0xffffffff);
              local_1d0 = (short *)(lVar1 + 0xc);
              iVar4 = *(int *)(psVar10 + -3);
              iVar3 = -iVar4;
              if (0 < iVar4) {
                iVar3 = iVar4;
              }
              fprintf(__s,"\t\t\"src_y\" : %d,\n",(long)(int)psVar10[3] / (long)iVar3 & 0xffffffff);
              psVar7 = (short *)(lVar1 + 6);
              iVar4 = *(int *)(psVar10 + -3);
              iVar3 = -iVar4;
              if (0 < iVar4) {
                iVar3 = iVar4;
              }
              fprintf(__s,"\t\t\"dst_x\" : %d,\n",(long)(int)*psVar10 / (long)iVar3 & 0xffffffff);
              psVar9 = (short *)(lVar1 + 8);
              psVar11 = (short *)(lVar1 + 10);
            }
            iVar4 = *(int *)(psVar10 + -3);
            iVar3 = -iVar4;
            if (0 < iVar4) {
              iVar3 = iVar4;
            }
            fprintf(__s,"\t\t\"dst_y\" : %d,\n",(long)(int)*psVar9 / (long)iVar3 & 0xffffffff);
            iVar4 = *(int *)(psVar10 + -3);
            iVar3 = -iVar4;
            if (0 < iVar4) {
              iVar3 = iVar4;
            }
            fprintf(__s,"\t\t\"dx\" : %d,\n",
                    (long)((int)*psVar7 - (int)*psVar11) / (long)iVar3 & 0xffffffff);
            iVar4 = *(int *)(psVar10 + -3);
            iVar3 = -iVar4;
            if (0 < iVar4) {
              iVar3 = iVar4;
            }
            fprintf(__s,"\t\t\"dy\" : %d\n",
                    (long)((int)*psVar9 - (int)*local_1d0) / (long)iVar3 & 0xffffffff);
            __size = 3;
            pcVar8 = "\t}\n";
          }
          else {
            if (iVar4 < 0) {
              fprintf(__s,"\t\t\"src_x\" : %d,\n",(long)(int)*psVar10 / (long)-iVar4 & 0xffffffff);
              local_1d0 = psVar10 + 1;
              iVar4 = *(int *)(psVar10 + -3);
              iVar3 = -iVar4;
              if (0 < iVar4) {
                iVar3 = iVar4;
              }
              fprintf(__s,"\t\t\"src_y\" : %d,\n",(long)(int)psVar10[1] / (long)iVar3 & 0xffffffff);
              psVar7 = psVar10 + 2;
              iVar4 = *(int *)(psVar10 + -3);
              iVar3 = -iVar4;
              if (0 < iVar4) {
                iVar3 = iVar4;
              }
              fprintf(__s,"\t\t\"dst_x\" : %d,\n",(long)(int)psVar10[2] / (long)iVar3 & 0xffffffff);
              psVar9 = psVar10 + 3;
              psVar11 = psVar10;
            }
            else {
              fprintf(__s,"\t\t\"src_x\" : %d,\n",(long)(int)psVar10[2] / (long)iVar4 & 0xffffffff);
              local_1d0 = (short *)(lVar1 + 0xc);
              iVar4 = *(int *)(psVar10 + -3);
              iVar3 = -iVar4;
              if (0 < iVar4) {
                iVar3 = iVar4;
              }
              fprintf(__s,"\t\t\"src_y\" : %d,\n",(long)(int)psVar10[3] / (long)iVar3 & 0xffffffff);
              psVar7 = (short *)(lVar1 + 6);
              iVar4 = *(int *)(psVar10 + -3);
              iVar3 = -iVar4;
              if (0 < iVar4) {
                iVar3 = iVar4;
              }
              fprintf(__s,"\t\t\"dst_x\" : %d,\n",(long)(int)*psVar10 / (long)iVar3 & 0xffffffff);
              psVar9 = (short *)(lVar1 + 8);
              psVar11 = (short *)(lVar1 + 10);
            }
            iVar4 = *(int *)(psVar10 + -3);
            iVar3 = -iVar4;
            if (0 < iVar4) {
              iVar3 = iVar4;
            }
            fprintf(__s,"\t\t\"dst_y\" : %d,\n",(long)(int)*psVar9 / (long)iVar3 & 0xffffffff);
            iVar4 = *(int *)(psVar10 + -3);
            iVar3 = -iVar4;
            if (0 < iVar4) {
              iVar3 = iVar4;
            }
            fprintf(__s,"\t\t\"dx\" : %d,\n",
                    (long)((int)*psVar7 - (int)*psVar11) / (long)iVar3 & 0xffffffff);
            iVar4 = *(int *)(psVar10 + -3);
            iVar3 = -iVar4;
            if (0 < iVar4) {
              iVar3 = iVar4;
            }
            fprintf(__s,"\t\t\"dy\" : %d\n",
                    (long)((int)*psVar9 - (int)*local_1d0) / (long)iVar3 & 0xffffffff);
            __size = 4;
            pcVar8 = "\t},\n";
          }
          fwrite(pcVar8,__size,1,__s);
          uVar12 = uVar12 + 1;
          uVar6 = (ulong)(long)*(int *)(lVar5 + 0x10) / 0x28;
          psVar10 = psVar10 + 0x14;
        } while (uVar12 < uVar6);
      }
      fwrite("]\n",2,1,__s);
      fclose(__s);
      printf("\rTotal Processed Frames:%d",(ulong)(uint)video_frame_count);
      fflush(_stdout);
      av_frame_unref(frame);
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int decode_packet(const AVPacket *pkt)
{
    int ret = avcodec_send_packet(video_dec_ctx, pkt);
    char szFileName[255] = {0};
    FILE *file=NULL;
    if (ret < 0) {
        fprintf(stderr, "Error while sending a packet to the decoder: %s\n", av_err2str(ret));
        return ret;
    }

    while (ret >= 0)  {
        ret = avcodec_receive_frame(video_dec_ctx, frame);
        if (ret == AVERROR(EAGAIN) || ret == AVERROR_EOF) {
            break;
        } else if (ret < 0) {
            fprintf(stderr, "Error while receiving a frame from the decoder: %s\n", av_err2str(ret));
            return ret;
        }

        if (ret >= 0) {
            int i;
            AVFrameSideData *sd;
	    video_frame_count++;
            sprintf(szFileName, "./output/mv/%d.json", video_frame_count);
            file = fopen(szFileName,"w");
            if (file == NULL)
            {
                fprintf(stderr, "Couldn't open file for reading\n");
                exit(1);
            }
            fprintf(file, "[\n");
            sd = av_frame_get_side_data(frame, AV_FRAME_DATA_MOTION_VECTORS);
            if (sd) {
                const AVMotionVector *mvs = (const AVMotionVector *)sd->data;
                for (i = 0; i < sd->size / sizeof(*mvs); i++) {
                    const AVMotionVector *mv = &mvs[i];
                    // print_motion_vectors_data(mv, video_frame_count);
                    if(i==(sd->size / sizeof(*mvs))-1){
                      fprintf(file, "\t{\n");
                      fprintf(file, "\t\t\"source\" : %d,\n", mv->source);
                      fprintf(file, "\t\t\"width\" : %d,\n", mv->w);
                      fprintf(file, "\t\t\"height\" : %d,\n", mv->h);
                      if(mv->source<0){
                        fprintf(file, "\t\t\"src_x\" : %d,\n", ((mv->src_x)/abs(mv->source)));
                        fprintf(file, "\t\t\"src_y\" : %d,\n", (mv->src_y)/abs(mv->source));
                        fprintf(file, "\t\t\"dst_x\" : %d,\n", (mv->dst_x/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_y\" : %d,\n", (mv->dst_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dx\" : %d,\n", ((mv->dst_x - mv->src_x)/abs(mv->source)));
                        fprintf(file, "\t\t\"dy\" : %d\n", ((mv->dst_y - mv->src_y)/abs(mv->source)));
                      }else{
                        fprintf(file, "\t\t\"src_x\" : %d,\n", (mv->dst_x/abs(mv->source)));
                        fprintf(file, "\t\t\"src_y\" : %d,\n", (mv->dst_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_x\" : %d,\n", (mv->src_x/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_y\" : %d,\n", (mv->src_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dx\" : %d,\n", ((mv->src_x - mv->dst_x)/abs(mv->source)));
                        fprintf(file, "\t\t\"dy\" : %d\n", ((mv->src_y - mv->dst_y)/abs(mv->source)));
                      }
                      fprintf(file, "\t}\n");
                    }else{
                      fprintf(file, "\t{\n");
                      fprintf(file, "\t\t\"source\" : %d,\n", mv->source);
                      fprintf(file, "\t\t\"width\" : %d,\n", mv->w);
                      fprintf(file, "\t\t\"height\" : %d,\n", mv->h);
                      if(mv->source<0){
                        fprintf(file, "\t\t\"src_x\" : %d,\n", (mv->src_x/abs(mv->source)));
                        fprintf(file, "\t\t\"src_y\" : %d,\n", (mv->src_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_x\" : %d,\n", (mv->dst_x/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_y\" : %d,\n", (mv->dst_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dx\" : %d,\n", ((mv->dst_x - mv->src_x)/abs(mv->source)));
                        fprintf(file, "\t\t\"dy\" : %d\n", ((mv->dst_y - mv->src_y)/abs(mv->source)));
                      }else{
                        fprintf(file, "\t\t\"src_x\" : %d,\n", (mv->dst_x/abs(mv->source)));
                        fprintf(file, "\t\t\"src_y\" : %d,\n", (mv->dst_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_x\" : %d,\n", (mv->src_x/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_y\" : %d,\n", (mv->src_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dx\" : %d,\n", ((mv->src_x - mv->dst_x)/abs(mv->source)));
                        fprintf(file, "\t\t\"dy\" : %d\n", ((mv->src_y - mv->dst_y)/abs(mv->source)));
                      }
                      fprintf(file, "\t},\n");
                    }
                }
                // printf("%s\n", strcat( "./output/", strcat(video_frame_count, ".json")));
            }
            fprintf(file, "]\n");
            fclose(file);
	    printf("\rTotal Processed Frames:%d", video_frame_count);
	    fflush(stdout);
            //Print frame data
            // print_frame_data(frame);
            av_frame_unref(frame);
        }
    }
    return 0;
}